

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covariance_matrix_generator.cc
# Opt level: O0

void webrtc::CovarianceMatrixGenerator::PhaseAlignmentMasks
               (size_t frequency_bin,size_t fft_size,int sample_rate,float sound_speed,
               vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               *geometry,float angle,ComplexMatrix<float> *mat)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  float local_3ac;
  float local_3a4;
  complex<float> local_390;
  float local_388;
  float local_384;
  float phase_shift;
  float distance;
  size_t c_ix;
  complex<float> **mat_els;
  undefined1 local_368 [4];
  float freq_in_hertz;
  size_t local_1f0;
  size_type local_1e8;
  string *local_1e0;
  string *_result_1;
  FatalMessage local_1c8;
  size_t local_50;
  uint local_44;
  string *local_40;
  string *_result;
  ComplexMatrix<float> *mat_local;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_> *pvStack_28
  ;
  float angle_local;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  *geometry_local;
  float sound_speed_local;
  int sample_rate_local;
  size_t fft_size_local;
  size_t frequency_bin_local;
  
  local_44 = 1;
  _result = (string *)mat;
  mat_local._4_4_ = angle;
  pvStack_28 = geometry;
  geometry_local._0_4_ = sound_speed;
  geometry_local._4_4_ = sample_rate;
  _sound_speed_local = fft_size;
  fft_size_local = frequency_bin;
  local_50 = Matrix<std::complex<float>_>::num_rows(&mat->super_Matrix<std::complex<float>_>);
  local_40 = rtc::CheckEQImpl<unsigned_int,unsigned_long>
                       (&local_44,&local_50,"1u == mat->num_rows()");
  if (local_40 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
               ,0x61,local_40);
    rtc::FatalMessage::stream(&local_1c8);
    rtc::FatalMessage::~FatalMessage(&local_1c8);
  }
  local_1e8 = std::
              vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              ::size(pvStack_28);
  local_1f0 = Matrix<std::complex<float>_>::num_columns((Matrix<std::complex<float>_> *)_result);
  local_1e0 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        (&local_1e8,&local_1f0,"geometry.size() == mat->num_columns()");
  if (local_1e0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
               ,0x62,local_1e0);
    rtc::FatalMessage::stream((FatalMessage *)local_368);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)local_368);
  }
  local_3a4 = (float)fft_size_local;
  local_3ac = (float)_sound_speed_local;
  mat_els._4_4_ = (local_3a4 / local_3ac) * (float)geometry_local._4_4_;
  c_ix = (size_t)Matrix<std::complex<float>_>::elements((Matrix<std::complex<float>_> *)_result);
  for (_phase_shift = 0; uVar1 = _phase_shift,
      sVar2 = std::
              vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              ::size(pvStack_28), uVar1 < sVar2; _phase_shift = _phase_shift + 1) {
    dVar6 = std::cos((double)(ulong)(uint)mat_local._4_4_);
    pvVar3 = std::
             vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             ::operator[](pvStack_28,_phase_shift);
    fVar4 = CartesianPoint<float>::x(pvVar3);
    dVar7 = std::sin((double)(ulong)(uint)mat_local._4_4_);
    pvVar3 = std::
             vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             ::operator[](pvStack_28,_phase_shift);
    fVar5 = CartesianPoint<float>::y(pvVar3);
    local_384 = SUB84(dVar6,0) * fVar4 + SUB84(dVar7,0) * fVar5;
    local_388 = (local_384 * -6.2831855 * mat_els._4_4_) / geometry_local._0_4_;
    dVar6 = cos((double)local_388);
    dVar7 = sin((double)local_388);
    std::complex<float>::complex(&local_390,(float)dVar6,(float)dVar7);
    *(_ComplexT *)(*(long *)c_ix + _phase_shift * 8) = local_390._M_value;
  }
  return;
}

Assistant:

void CovarianceMatrixGenerator::PhaseAlignmentMasks(
    size_t frequency_bin,
    size_t fft_size,
    int sample_rate,
    float sound_speed,
    const std::vector<Point>& geometry,
    float angle,
    ComplexMatrix<float>* mat) {
  RTC_CHECK_EQ(1u, mat->num_rows());
  RTC_CHECK_EQ(geometry.size(), mat->num_columns());

  float freq_in_hertz =
      (static_cast<float>(frequency_bin) / fft_size) * sample_rate;

  complex<float>* const* mat_els = mat->elements();
  for (size_t c_ix = 0; c_ix < geometry.size(); ++c_ix) {
    float distance = std::cos(angle) * geometry[c_ix].x() +
                     std::sin(angle) * geometry[c_ix].y();
    float phase_shift = -2.f * M_PI * distance * freq_in_hertz / sound_speed;

    // Euler's formula for mat[0][c_ix] = e^(j * phase_shift).
    mat_els[0][c_ix] = complex<float>(cos(phase_shift), sin(phase_shift));
  }
}